

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Palette.cpp
# Opt level: O2

void __thiscall Palette::Palette(Palette *this)

{
  _Rb_tree_header *p_Var1;
  map<int,_Colour_*,_std::less<int>,_std::allocator<std::pair<const_int,_Colour_*>_>_> *pmVar2;
  string local_38;
  allocator local_11;
  
  pmVar2 = (map<int,_Colour_*,_std::less<int>,_std::allocator<std::pair<const_int,_Colour_*>_>_> *)
           operator_new(0x30);
  p_Var1 = &(pmVar2->_M_t)._M_impl.super__Rb_tree_header;
  (pmVar2->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (pmVar2->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  *(undefined8 *)&(pmVar2->_M_t)._M_impl = 0;
  *(undefined8 *)&(pmVar2->_M_t)._M_impl.super__Rb_tree_header._M_header = 0;
  (pmVar2->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (pmVar2->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (pmVar2->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->colours = pmVar2;
  std::__cxx11::string::string((string *)&local_38,"Green",&local_11);
  setColour(this,0,&local_38,0xaaff00);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string((string *)&local_38,"Orange",&local_11);
  setColour(this,1,&local_38,0xffaa00);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string((string *)&local_38,"Pink",&local_11);
  setColour(this,2,&local_38,0xff00aa);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string((string *)&local_38,"Purple",&local_11);
  setColour(this,3,&local_38,0xaa00ff);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string((string *)&local_38,"Blue",&local_11);
  setColour(this,4,&local_38,0xaaff);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string((string *)&local_38,"Red",&local_11);
  setColour(this,5,&local_38,0xff0036);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string((string *)&local_38,"Yellow",&local_11);
  setColour(this,6,&local_38,0xfff000);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string((string *)&local_38,"Black",&local_11);
  setColour(this,7,&local_38,0);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string((string *)&local_38,"White",&local_11);
  setColour(this,8,&local_38,0xffffff);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string((string *)&local_38,"Grey",&local_11);
  setColour(this,9,&local_38,0x999999);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string((string *)&local_38,"Navy",&local_11);
  setColour(this,10,&local_38,0x71865);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

Palette::Palette() {
    colours = new map<int, Colour*>();
    setColour(GREEN, "Green", 0xAAFF00);
    setColour(ORANGE, "Orange", 0xFFAA00);
    setColour(PINK, "Pink", 0xFF00AA);
    setColour(PURPLE, "Purple", 0xAA00FF);
    setColour(BLUE, "Blue", 0x00AAFF);
    setColour(RED, "Red", 0xFF0036);
    setColour(YELLOW, "Yellow", 0xFFF000);
    setColour(BLACK, "Black", 0x000000);
    setColour(WHITE, "White", 0xFFFFFF);
    setColour(GREY, "Grey", 0x999999);
    setColour(NAVY, "Navy", 0x071865);
}